

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterUnix.h
# Opt level: O3

void __thiscall PixelToaster::UnixDisplay::handleEvent(UnixDisplay *this,XEvent *event)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  UnixDisplay *pUVar7;
  ulong uVar8;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  code *UNRECOVERED_JUMPTABLE;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined1 *puVar9;
  undefined8 uVar10;
  uint uVar11;
  long *plVar6;
  
  iVar3 = event->type;
  if (5 < iVar3) {
    if (iVar3 != 6) {
      if (iVar3 != 0x21) {
        return;
      }
      if ((event->xkey).root != this->wmProtocols_) {
        return;
      }
      if ((event->xexpose).width != 0x20) {
        return;
      }
      if ((event->xkey).time != this->wmDeleteWindow_) {
        return;
      }
      iVar3 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])
                        (this);
      if (CONCAT44(extraout_var_02,iVar3) != 0) {
        iVar3 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])
                          (this);
        iVar5 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                          (this);
        pUVar7 = this;
        if (CONCAT44(extraout_var_04,iVar5) != 0) {
          uVar11 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface
                     [0x10])(this,this);
          pUVar7 = (UnixDisplay *)(ulong)uVar11;
        }
        cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x58))
                          ((long *)CONCAT44(extraout_var_03,iVar3),pUVar7);
        if (cVar1 == '\0') {
          return;
        }
      }
      this->isShuttingDown_ = true;
      return;
    }
    iVar3 = (event->xkey).x;
    uVar11 = (event->xkey).state;
    iVar5 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])(this)
    ;
    if (CONCAT44(extraout_var_05,iVar5) == 0) {
      return;
    }
    iVar5 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])(this)
    ;
    plVar6 = (long *)CONCAT44(extraout_var_06,iVar5);
    iVar5 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                      (this);
    if (CONCAT44(extraout_var_07,iVar5) != 0) {
      uVar4 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                        (this);
      this = (UnixDisplay *)(ulong)uVar4;
    }
    uVar10 = CONCAT44((float)iVar3,(uVar11 & 0x400) << 6 | uVar11 >> 1 & 0x100 | uVar11 >> 8 & 1);
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar6 + 0x40);
LAB_00108d33:
    (*UNRECOVERED_JUMPTABLE)(plVar6,this,uVar10);
    return;
  }
  if (1 < iVar3 - 2U) {
    if (1 < iVar3 - 4U) {
      return;
    }
    iVar5 = (event->xkey).x;
    uVar11 = (event->xkey).keycode;
    uVar11 = (uint)CONCAT12(uVar11 == 3,CONCAT11(uVar11 == 2,uVar11 == 1));
    iVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])(this)
    ;
    if (iVar3 == 4) {
      if (CONCAT44(extraout_var,iVar2) == 0) {
        return;
      }
      iVar3 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])
                        (this);
      plVar6 = (long *)CONCAT44(extraout_var_00,iVar3);
      iVar3 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                        (this);
      if (CONCAT44(extraout_var_01,iVar3) != 0) {
        uVar4 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                          (this);
        this = (UnixDisplay *)(ulong)uVar4;
      }
      uVar10 = CONCAT44((float)iVar5,uVar11);
      UNRECOVERED_JUMPTABLE = *(code **)(*plVar6 + 0x30);
    }
    else {
      if (CONCAT44(extraout_var,iVar2) == 0) {
        return;
      }
      iVar3 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])
                        (this);
      plVar6 = (long *)CONCAT44(extraout_var_08,iVar3);
      iVar3 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                        (this);
      if (CONCAT44(extraout_var_09,iVar3) != 0) {
        uVar4 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                          (this);
        this = (UnixDisplay *)(ulong)uVar4;
      }
      uVar10 = CONCAT44((float)iVar5,uVar11);
      UNRECOVERED_JUMPTABLE = *(code **)(*plVar6 + 0x38);
    }
    goto LAB_00108d33;
  }
  uVar11 = 0;
  uVar8 = XkbKeycodeToKeysym(this->display_,(event->xmotion).is_hint,0,0);
  if ((char)(uVar8 >> 8) == '\0') {
    puVar9 = &normalKeys_;
LAB_00108d54:
    uVar11 = *(uint *)(puVar9 + (uVar8 & 0xff) * 4);
  }
  else if (((uint)(uVar8 >> 8) & 0xff) == 0xff) {
    puVar9 = &functionKeys_;
    goto LAB_00108d54;
  }
  uVar8 = (ulong)uVar11;
  if (event->type != 2) {
    (&keyIsReleased_)[uVar8] = 1;
    return;
  }
  if ((&keyIsPressed_)[uVar8] == '\0') {
    iVar3 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])(this)
    ;
    if (CONCAT44(extraout_var_10,iVar3) != 0) {
      iVar3 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])
                        (this);
      iVar5 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                        (this);
      pUVar7 = this;
      if (CONCAT44(extraout_var_12,iVar5) != 0) {
        uVar4 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                          (this,this);
        pUVar7 = (UnixDisplay *)(ulong)uVar4;
      }
      (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar3) + 0x18))
                ((long *)CONCAT44(extraout_var_11,iVar3),pUVar7,uVar8);
      iVar3 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])
                        (this);
      cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar3) + 0x10))
                        ((long *)CONCAT44(extraout_var_13,iVar3));
      if (cVar1 == '\0') goto LAB_00108de1;
    }
    if (uVar11 == 0x1b) {
      this->isShuttingDown_ = true;
    }
  }
LAB_00108de1:
  (&keyIsPressed_)[uVar8] = 1;
  (&keyIsReleased_)[uVar8] = 0;
  return;
}

Assistant:

void handleEvent(const ::XEvent& event)
    {
        switch (event.type)
        {
            case KeyPress:
            case KeyRelease:
            {
                const KeySym keySym = ::XkbKeycodeToKeysym(display_, event.xkey.keycode, 0, 0);
                const int    hiSym  = (keySym & 0xff00) >> 8;
                const int    loSym  = keySym & 0xff;

                Key key = Key::Undefined;
                switch (hiSym)
                {
                    case 0x00:
                        key = normalKeys_[loSym];
                        break;
                    case 0xff:
                        key = functionKeys_[loSym];
                        break;
                }

                if (event.type == KeyPress)
                {
                    if (!keyIsPressed_[key])
                    {
                        bool defaultKeyHandlers = true;

                        if (listener())
                        {
                            listener()->onKeyDown(wrapper() ? *wrapper() : *(DisplayInterface*)this, key);
                            defaultKeyHandlers = listener()->defaultKeyHandlers();
                        }

                        if (defaultKeyHandlers && key == Key::Escape)
                        {
                            isShuttingDown_ = true;
                        }
                    }
                    keyIsPressed_[key]  = true;
                    keyIsReleased_[key] = false;
                }
                else
                {
                    keyIsReleased_[key] = true;
                }
                break;
            }

            case ButtonPress:
            case ButtonRelease:
            {
                Mouse mouse;
                mouse.x              = static_cast<float>(event.xbutton.x);
                mouse.y              = static_cast<float>(event.xbutton.y);
                mouse.buttons.left   = event.xbutton.button == Button1;
                mouse.buttons.middle = event.xbutton.button == Button2;
                mouse.buttons.right  = event.xbutton.button == Button3;
                if (event.type == ButtonPress)
                {
                    if (listener())
                        listener()->onMouseButtonDown(wrapper() ? *wrapper() : *(DisplayInterface*)this, mouse);
                }
                else
                {
                    if (listener())
                        listener()->onMouseButtonUp(wrapper() ? *wrapper() : *(DisplayInterface*)this, mouse);
                }
                break;
            }
            case MotionNotify:
            {
                Mouse mouse;
                mouse.x              = static_cast<float>(event.xmotion.x);
                mouse.y              = static_cast<float>(event.xmotion.y);
                mouse.buttons.left   = event.xmotion.state & Button1Mask;
                mouse.buttons.middle = event.xmotion.state & Button2Mask;
                mouse.buttons.right  = event.xmotion.state & Button3Mask;
                if (listener())
                    listener()->onMouseMove(wrapper() ? *wrapper() : *(DisplayInterface*)this, mouse);
                break;
            }
            case ClientMessage:
            {
                if (event.xclient.message_type == wmProtocols_ &&
                    event.xclient.format == 32 &&
                    event.xclient.data.l[0] == (long)wmDeleteWindow_)
                {
                    if (listener())
                    {
                        if (listener()->onClose(wrapper() ? *wrapper() : *(DisplayInterface*)this))
                            isShuttingDown_ = true;
                    }
                    else
                    {
                        isShuttingDown_ = true;
                    }
                }
                break;
            }
        }
    }